

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O3

void linreg_multi(int p,double *xi,double *y,int N,double *b,double *sigma2,double *xxti,double *R2,
                 double *res,double alpha,double *anv,double *ci_lower,double *ci_upper,int *rank,
                 char *llsmethod,int intercept)

{
  int iVar1;
  double *col;
  double *sig;
  double *C;
  double *C_00;
  double *A;
  double *C_01;
  int *ipiv;
  double *C_02;
  double *C_03;
  double *C_04;
  ulong uVar2;
  size_t sVar3;
  size_t __size;
  ulong uVar4;
  int num;
  double *__dest;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  lVar5 = (long)p;
  sVar3 = lVar5 * 8;
  lVar6 = (long)N;
  col = (double *)malloc(sVar3 * lVar6);
  sig = (double *)malloc(sVar3 * lVar6);
  C = (double *)malloc(lVar6 * 8);
  __size = sVar3 * lVar5;
  C_00 = (double *)malloc(__size);
  A = (double *)malloc(__size);
  C_01 = (double *)malloc(sVar3);
  ipiv = (int *)malloc(lVar5 * 4);
  C_02 = (double *)calloc(1,8);
  C_03 = (double *)malloc(sVar3);
  C_04 = (double *)calloc(1,8);
  uVar4 = (ulong)(uint)N;
  if (intercept == 1) {
    if (0 < N) {
      uVar2 = 0;
      do {
        sig[uVar2] = 1.0;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
    if (N < N * p) {
      sVar3 = (ulong)((p + -1) * N - 1) * 8 + 8;
      __dest = sig + lVar6;
LAB_0012bfd5:
      memcpy(__dest,xi,sVar3);
    }
  }
  else if ((intercept == 0) && (0 < N * p)) {
    sVar3 = (ulong)(uint)(N * p) << 3;
    __dest = sig;
    goto LAB_0012bfd5;
  }
  mtranspose(sig,p,N,col);
  mmult(sig,col,C_00,p,N,p);
  memcpy(A,C_00,__size);
  mmult(sig,y,C_01,p,N,1);
  if (0 < p) {
    if (((*llsmethod == 'q') && (llsmethod[1] == 'r')) && (llsmethod[2] == '\0')) {
      iVar1 = lls_qr(C_00,C_01,p,p,b);
      *rank = iVar1;
    }
    else {
      iVar1 = strcmp(llsmethod,"normal");
      if (iVar1 == 0) {
        lls_normal(C_00,C_01,p,p,b);
      }
      else {
        iVar1 = strcmp(llsmethod,"svd");
        if (iVar1 != 0) {
          puts("This function only accepts one of three least square methods - ");
          puts(" qr, normal and svd. ");
          exit(-1);
        }
        lls_svd2(C_00,C_01,p,p,b);
      }
      puts(
          "Warning - This method will not calculate the rank of the regression. Use method qr instead. "
          );
    }
  }
  iVar1 = N - p;
  mmult(y,y,C_04,1,N,1);
  mmult(sig,y,C_03,p,N,1);
  mmult(b,C_03,C_02,1,p,1);
  dVar7 = (double)iVar1;
  dVar10 = (*C_04 - *C_02) / dVar7;
  *sigma2 = dVar10;
  ludecomp(A,p,ipiv);
  minverse(A,p,ipiv,xxti);
  if (p != 0) {
    uVar2 = 0;
    do {
      xxti[uVar2] = xxti[uVar2] * dVar10;
      uVar2 = uVar2 + 1;
    } while (p * p + (uint)(p * p == 0) != uVar2);
  }
  dVar13 = 0.0;
  if (0 < N) {
    uVar2 = 0;
    do {
      dVar13 = dVar13 + y[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
  }
  dVar11 = 1.0;
  if (intercept != 1) {
    dVar11 = 0.0;
  }
  dVar15 = (double)N;
  dVar14 = (dVar13 / dVar15) * (dVar13 / dVar15);
  dVar12 = -dVar15;
  dVar13 = (*C_02 + dVar12 * dVar14) / (dVar12 * dVar14 + *C_04);
  *R2 = dVar13;
  R2[1] = 1.0 - ((1.0 - dVar13) * (dVar15 - dVar11)) / dVar7;
  dVar13 = alpha * 0.5;
  if (0 < p) {
    uVar2 = 0;
    do {
      dVar8 = *xxti;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar9 = tinv(dVar13,iVar1);
      ci_lower[uVar2] = b[uVar2] - dVar9 * dVar8;
      ci_upper[uVar2] = dVar9 * dVar8 + b[uVar2];
      uVar2 = uVar2 + 1;
      xxti = xxti + (ulong)(uint)p + 1;
    } while ((uint)p != uVar2);
  }
  dVar8 = chiinv(dVar13,iVar1);
  dVar13 = chiinv(1.0 - dVar13,iVar1);
  ci_lower[lVar5] = (dVar10 * dVar7) / dVar13;
  ci_upper[lVar5] = (dVar10 * dVar7) / dVar8;
  mmult(col,b,C,N,p,1);
  dVar10 = 0.0;
  if (N < 1) {
    dVar13 = 0.0;
  }
  else {
    uVar2 = 0;
    do {
      res[uVar2] = y[uVar2] - C[uVar2];
      uVar2 = uVar2 + 1;
    } while (uVar4 != uVar2);
    dVar13 = 0.0;
    if (0 < N) {
      uVar2 = 0;
      dVar10 = 0.0;
      do {
        dVar10 = dVar10 + C[uVar2] * C[uVar2];
        dVar13 = dVar13 + res[uVar2] * res[uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
    }
  }
  if (intercept == 1) {
    if (p == 1) {
      dVar13 = dVar12 * dVar14 + *C_04;
      dVar10 = *R2 * dVar13;
      anv[1] = dVar10;
      dVar13 = (1.0 - *R2) * dVar13;
      anv[2] = dVar13;
      *anv = dVar13 + dVar10;
      anv[3] = 0.0;
      lVar5 = 0x20;
    }
    else {
      if (p < 2) goto LAB_0012c642;
      dVar13 = dVar12 * dVar14 + *C_04;
      dVar10 = *R2 * dVar13;
      anv[1] = dVar10;
      dVar13 = (1.0 - *R2) * dVar13;
      anv[2] = dVar13;
      *anv = dVar13 + dVar10;
      anv[3] = (double)p + -1.0;
      anv[4] = dVar7;
      dVar13 = *R2;
      dVar10 = dVar13 / ((double)p + -1.0);
LAB_0012c613:
      dVar10 = dVar10 / ((1.0 - dVar13) / dVar7);
      anv[5] = dVar10;
      num = p + -1;
LAB_0012c61f:
      dVar7 = fcdf(dVar10,num,iVar1);
      dVar7 = 1.0 - dVar7;
      lVar5 = 0x30;
    }
  }
  else {
    dVar12 = dVar10 + dVar13;
    *R2 = dVar10 / dVar12;
    R2[1] = 1.0 - ((dVar15 - dVar11) * (1.0 - dVar10 / dVar12)) / dVar7;
    if (p == 1) {
      anv[1] = dVar10;
      anv[2] = dVar13;
      *anv = dVar12;
      anv[3] = 1.0;
      anv[4] = dVar7;
      dVar10 = *R2 / ((1.0 - *R2) / dVar7);
      anv[5] = dVar10;
      num = 1;
      goto LAB_0012c61f;
    }
    if (1 < p) {
      anv[1] = dVar10;
      anv[2] = dVar13;
      *anv = dVar12;
      anv[3] = (double)p;
      anv[4] = dVar7;
      dVar13 = *R2;
      dVar10 = dVar13 / (double)p;
      goto LAB_0012c613;
    }
    if (p != 0) goto LAB_0012c642;
    anv[1] = dVar10;
    anv[2] = dVar13;
    *anv = dVar12;
    anv[3] = 0.0;
    anv[4] = dVar7;
    anv[5] = NAN;
    dVar7 = NAN;
    lVar5 = 0x30;
  }
  *(double *)((long)anv + lVar5) = dVar7;
LAB_0012c642:
  free(ipiv);
  free(col);
  free(sig);
  free(C_00);
  free(A);
  free(C_01);
  free(C_02);
  free(C_03);
  free(C_04);
  free(C);
  return;
}

Assistant:

void linreg_multi(int p, double *xi, double *y, int N, double* b, double *sigma2,
	double *xxti, double *R2, double *res, double alpha, double *anv,
	double* ci_lower, double* ci_upper, int *rank, char *llsmethod, int intercept) {
	/*
	p corresponds to number of coefficients (including the intercept)
	intercept - 1 : include intercept term. 0 : No intercept term
	*/
	double *x, *xt, *seb, *xb;
	double *xxt, *yxt, *temp1, *temp2, *bt, *xxt2;
	int i, df;
	int *ipiv;
	double tmp1, sum, ym, ym2, a2, ta2, intrvl, chia2, chi1a2, dfi, mss, rss;

	/*
	* Matrix Based Multiple Regression
	* y has the length N
	* xi has the length (p-1) X N. It contains p-1 independent variables
	* of length N each
	*/

	x = (double*)malloc(sizeof(double) * p * N);
	xt = (double*)malloc(sizeof(double) * p * N);
	xb = (double*)malloc(sizeof(double) * N);
	xxt = (double*)malloc(sizeof(double) * p * p);
	xxt2 = (double*)malloc(sizeof(double) * p * p);
	yxt = (double*)malloc(sizeof(double) * p);
	ipiv = (int*)malloc(sizeof(int) * p);
	//yt = (double*) malloc (sizeof(double) * N);
	temp1 = (double*)calloc(1, sizeof(double));
	temp2 = (double*)malloc(sizeof(double) * p);
	seb = (double*)malloc(sizeof(double) * p);
	bt = (double*)calloc(1, sizeof(double));

	// Initalize xt matrix - Transpose Matrix is initilaized first to
	// deal with column major nature of the X matrix

	if (intercept == 1) {
		for (i = 0; i < N; ++i) {
			xt[i] = 1.;
		}

		for (i = N; i < p*N; ++i) {
			xt[i] = xi[i - N];
		}
	}
	else if (intercept == 0) {
		for (i = 0; i < p*N; ++i) {
			xt[i] = xi[i];
		}
	}


	// Calculate x * x'

	mtranspose(xt, p, N, x);

	//cblas_dgemm(CblasRowMajor,CblasNoTrans,CblasNoTrans,ra,cb,ca,1.0,x,ca,xt,cb,0.0,xxt,cb);
	mmult(xt, x, xxt, p, N, p);
	memcpy(xxt2, xxt, sizeof(double)*p*p);

	// Calculate  x' * y

	//cblas_dgemm(CblasRowMajor,CblasNoTrans,CblasNoTrans,ra,cb,ca,1.0,y,ca,xt,cb,0.0,yxt,cb);
	mmult(xt, y, yxt, p, N, 1);

	// Find LU decomposition and then solve Ax = B
	// A = L * U where A = xxt
	// x is b vector and
	// B is yxt

	//ludecomp(xxt,p,ipiv);
	//linsolve(xxt,p,yxt,ipiv,b);
	if (p > 0) {
		if (!strcmp(llsmethod, "qr")) {
			*rank = lls_qr(xxt, yxt, p, p, b);
		}
		else if (!strcmp(llsmethod, "normal")) {
			lls_normal(xxt, yxt, p, p, b);
			printf("Warning - This method will not calculate the rank of the regression. Use method qr instead. \n");
		}
		else if (!strcmp(llsmethod, "svd")) {
			lls_svd2(xxt, yxt, p, p, b);
			printf("Warning - This method will not calculate the rank of the regression. Use method qr instead. \n");
		}
		else {
			printf("This function only accepts one of three least square methods - \n");
			printf(" qr, normal and svd. \n");
			exit(-1);
		}
	}

	//Find Variance of the residuals

	//mtranspose(y,N,1,yt);
	df = N - p;
	mmult(y, y, bt, 1, N, 1);
	mmult(xt, y, temp2, p, N, 1);
	mmult(b, temp2, temp1, 1, p, 1);

	*sigma2 = *bt - *temp1;
	*sigma2 /= (double)df;
	tmp1 = *sigma2;

	// Variance-Covariance Matrix of beta parameters
	ludecomp(xxt2, p, ipiv);
	minverse(xxt2, p, ipiv, xxti);

	for (i = 0; i < p*p; ++i) {
		xxti[i] *= tmp1;
	}


	// r^2 Goodness of fit
	sum = 0.;
	for (i = 0; i < N; ++i) {
		sum += y[i];
	}
	ym = sum / N;
	ym2 = ym * ym;

	R2[0] = (*temp1 - N*ym2) / (*bt - N*ym2);

	// Adjusted r^2

	dfi = intercept == 1 ? 1.0 : 0.0;

	R2[1] = 1.0 - (1.0 - R2[0]) * ((double)N - dfi) / ((double)df);

	a2 = alpha / 2.;

	//Confidence Interval for beta parameters

	for (i = 0; i < p; ++i) {
		seb[i] = sqrt(xxti[i*(p + 1)]);

		ta2 = tinv(a2, df);
		intrvl = ta2 * seb[i];

		ci_lower[i] = b[i] - intrvl;
		ci_upper[i] = b[i] + intrvl;

	}

	// confidence interval for sigma^2

	chia2 = chiinv(a2, df);
	chi1a2 = chiinv(1. - a2, df);

	ci_lower[p] = (double)df * tmp1 / chi1a2;
	ci_upper[p] = (double)df * tmp1 / chia2;

	//Residual
	/* u = y - Xb
	*/
	mmult(x, b, xb, N, p, 1);

	for (i = 0; i < N; ++i) {
		res[i] = y[i] - xb[i];
	}


	mss = 0.0;
	rss = 0.0;

	for (i = 0; i < N; ++i) {
		mss += (xb[i] * xb[i]);
		rss += (res[i] * res[i]);
	}

	// ANOVA

	/*
	* ANOVA
	*
	* anv[0] - TSS Total Sum Of Squares
	* anv[1] - ESS Explained Sum Of Squares
	* anv[2] - RSS Residual Sum Of Squares
	* anv[3] - degrees of freedom of ESS
	* anv[4] - degrees of freedom of RSS
	* anv[5] - F Statistics = (R^2/p-1)/((1-R^2)/N-p)
	* anv[6] - P value associated with anv[5] used to reject/accept
	* zero hypothesis
	*/

	if (intercept == 1) {
		if (p == 1) {
			anv[1] = R2[0] * (*bt - N*ym2);
			anv[2] = (1. - R2[0]) * (*bt - N*ym2);
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p - dfi;
			anv[4] = (double)df;
		}
		else if (p > 1) {
			anv[1] = R2[0] * (*bt - N*ym2);
			anv[2] = (1. - R2[0]) * (*bt - N*ym2);
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p - dfi;
			anv[4] = (double)df;
			anv[5] = (R2[0] / anv[3]) / ((1. - R2[0]) / anv[4]);
			anv[6] = 1.0 - fcdf(anv[5], p - 1, df);
		}
	}
	else {
		R2[0] = mss / (mss + rss);
		R2[1] = 1.0 - (1.0 - R2[0]) * ((double)N - dfi) / ((double)df);
		if (p == 1) {
			anv[1] = mss;
			anv[2] = rss;
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p;
			anv[4] = (double)df;
			anv[5] = (R2[0] / anv[3]) / ((1. - R2[0]) / anv[4]);
			anv[6] = 1.0 - fcdf(anv[5], p, df);
		}
		else if (p > 1) {
			anv[1] = mss;
			anv[2] = rss;
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p;
			anv[4] = (double)df;
			anv[5] = (R2[0] / anv[3]) / ((1. - R2[0]) / anv[4]);
			anv[6] = 1.0 - fcdf(anv[5], p - 1, df);
		}
		else if (p == 0) {
			anv[1] = mss;
			anv[2] = rss;
			anv[0] = anv[1] + anv[2];
			anv[3] = (double)p;
			anv[4] = (double)df;
			anv[5] = NAN;
			anv[6] = NAN;
		}
	}


	free(ipiv);
	free(x);
	free(xt);
	free(xxt);
	free(xxt2);
	free(yxt);
	free(temp1);
	free(temp2);
	free(bt);
	free(seb);
	free(xb);
}